

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O1

void PLM::PredictVelOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  int iVar16;
  pair<bool,_bool> pVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  double *pdVar35;
  double *pdVar36;
  long lVar37;
  double *pdVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  int iVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  bool bVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  double dVar70;
  double dVar71;
  Real qp_1;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  Real qm;
  Real qk;
  BCRec *bc;
  int local_2e8;
  int local_2e4;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  double *local_220;
  double *local_218;
  double *local_1e8;
  double *local_1e0;
  double local_1c8;
  ulong local_1b8;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  
  dVar50 = dt / (geom->super_CoordSys).dx[2];
  iVar3 = (geom->domain).smallend.vect[2];
  iVar4 = (geom->domain).bigend.vect[2];
  pVar17 = anon_unknown.dwarf_4dee56::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,2);
  if (((((ushort)pVar17 & 1) == 0) || (iVar3 < (zebox->smallend).vect[2] + -1)) &&
     ((((ushort)pVar17 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar4)))) {
    if (0 < ncomp) {
      lVar12 = Ipz->jstride;
      lVar13 = Imz->jstride;
      iVar3 = (zebox->smallend).vect[1];
      lVar30 = (long)iVar3;
      iVar4 = (zebox->smallend).vect[0];
      lVar41 = (long)iVar4;
      lVar14 = q->jstride;
      local_268 = q->p + (((lVar30 - (q->begin).y) * lVar14 + lVar41) - (long)(q->begin).x);
      lVar27 = vcc->nstride * 0x10 + (lVar30 - (vcc->begin).y) * vcc->jstride * 8 + lVar41 * 8 +
               (long)(vcc->begin).x * -8;
      lVar45 = q->nstride;
      iVar5 = (q->begin).z;
      pdVar15 = vcc->p;
      local_260 = Ipz->p + (((lVar30 - (Ipz->begin).y) * lVar12 + lVar41) - (long)(Ipz->begin).x);
      lVar20 = Ipz->kstride;
      lVar24 = Ipz->nstride;
      iVar6 = (Ipz->begin).z;
      local_1e0 = Imz->p + (((lVar30 - (Imz->begin).y) * lVar13 + lVar41) - (long)(Imz->begin).x);
      lVar41 = Imz->kstride;
      lVar40 = Imz->nstride;
      iVar29 = (Imz->begin).z;
      iVar8 = (zebox->smallend).vect[2];
      iVar9 = (zebox->bigend).vect[2];
      iVar10 = (zebox->bigend).vect[0];
      iVar11 = (zebox->bigend).vect[1];
      lVar32 = vcc->kstride * 8;
      lVar33 = -(long)(vcc->begin).z;
      lVar25 = vcc->jstride * 8;
      lVar37 = q->kstride * 8;
      iVar19 = iVar8 - iVar5;
      lVar23 = -(long)iVar5;
      uVar28 = 0;
      do {
        local_2e8 = iVar8 + -1;
        local_2e4 = iVar19 + -3;
        iVar5 = iVar8;
        iVar18 = iVar19 + -2;
        iVar22 = iVar19 + 2;
        iVar16 = iVar19;
        if (iVar8 <= iVar9) {
          do {
            if (iVar3 <= iVar11) {
              lVar21 = (long)iVar5;
              pdVar47 = (double *)((lVar21 - iVar29) * lVar41 * 8 + (long)local_1e0);
              lVar46 = (long)local_2e8;
              pdVar36 = (double *)((lVar46 - iVar6) * lVar20 * 8 + (long)local_260);
              lVar26 = (long)pdVar15 + (lVar33 + lVar46) * lVar32 + lVar27;
              lVar48 = (long)pdVar15 + (lVar33 + lVar21) * lVar32 + lVar27;
              pdVar35 = (double *)(local_2e4 * lVar37 + (long)local_268);
              pdVar31 = (double *)(iVar22 * lVar37 + (long)local_268);
              pdVar34 = (double *)(iVar18 * lVar37 + (long)local_268);
              pdVar38 = (double *)((iVar16 + 1) * lVar37 + (long)local_268);
              pdVar42 = (double *)((lVar46 + lVar23) * lVar37 + (long)local_268);
              pdVar39 = (double *)((lVar21 + lVar23) * lVar37 + (long)local_268);
              lVar21 = lVar30;
              do {
                if (iVar4 <= iVar10) {
                  lVar46 = 0;
                  do {
                    dVar1 = pdVar39[lVar46];
                    dVar2 = pdVar42[lVar46];
                    dVar51 = dVar2 - pdVar34[lVar46];
                    dVar67 = dVar1 - dVar2;
                    dVar53 = 0.0;
                    dVar59 = ABS(dVar51);
                    dVar60 = ABS(dVar67);
                    dVar52 = 0.0;
                    if (0.0 <= dVar67 * dVar51) {
                      dVar52 = dVar60;
                      if (dVar59 <= dVar60) {
                        dVar52 = dVar59;
                      }
                      dVar52 = dVar52 + dVar52;
                    }
                    dVar57 = pdVar31[lVar46] - pdVar38[lVar46];
                    dVar55 = pdVar38[lVar46] - dVar1;
                    if (0.0 <= dVar55 * dVar57) {
                      dVar53 = ABS(dVar57);
                      if (ABS(dVar55) <= ABS(dVar57)) {
                        dVar53 = ABS(dVar55);
                      }
                      dVar53 = dVar53 + dVar53;
                    }
                    dVar56 = 0.0;
                    dVar71 = 0.0;
                    if (0.0 <= dVar67 * dVar55) {
                      dVar71 = ABS(dVar55);
                      if (ABS(dVar67) <= ABS(dVar55)) {
                        dVar71 = ABS(dVar67);
                      }
                      dVar71 = dVar71 + dVar71;
                    }
                    dVar58 = pdVar34[lVar46] - pdVar35[lVar46];
                    if (0.0 <= dVar51 * dVar58) {
                      dVar56 = ABS(dVar51);
                      if (ABS(dVar58) <= ABS(dVar51)) {
                        dVar56 = ABS(dVar58);
                      }
                      dVar56 = dVar56 + dVar56;
                    }
                    dVar61 = 0.0;
                    dVar72 = 0.0;
                    if (0.0 <= dVar67 * dVar55) {
                      dVar72 = ABS(dVar55);
                      if (ABS(dVar67) <= ABS(dVar55)) {
                        dVar72 = ABS(dVar67);
                      }
                      dVar72 = dVar72 + dVar72;
                    }
                    if (0.0 <= dVar67 * dVar51) {
                      if (dVar59 <= dVar60) {
                        dVar60 = dVar59;
                      }
                      dVar61 = dVar60 + dVar60;
                    }
                    dVar58 = (dVar58 + dVar51) * 0.5;
                    dVar76 = (dVar55 + dVar67) * 0.5;
                    auVar62._0_8_ = ABS(dVar58);
                    auVar62._8_8_ = ABS(dVar76);
                    auVar63._8_4_ = SUB84(dVar72,0);
                    auVar63._0_8_ = dVar56;
                    auVar63._12_4_ = (int)((ulong)dVar72 >> 0x20);
                    auVar63 = minpd(auVar62,auVar63);
                    dVar60 = *(double *)(lVar48 + lVar46 * 8);
                    dVar59 = (dVar51 + dVar67) * 0.5;
                    dVar51 = (dVar57 + dVar55) * 0.5;
                    auVar54._0_8_ = (ulong)dVar59 & 0x8000000000000000;
                    auVar54._8_8_ = (ulong)dVar51 & 0x8000000000000000;
                    auVar64._0_8_ = ABS(dVar59);
                    auVar64._8_8_ = ABS(dVar51);
                    auVar65._8_4_ = SUB84(dVar53,0);
                    auVar65._0_8_ = dVar52;
                    auVar65._12_4_ = (int)((ulong)dVar53 >> 0x20);
                    auVar65 = minpd(auVar64,auVar65);
                    dVar53 = SUB168(auVar54 | _DAT_0078ba10,0);
                    dVar52 = ABS(dVar76 * 1.3333333333333333 +
                                 (auVar65._8_8_ * SUB168(auVar54 | _DAT_0078ba10,8) +
                                 auVar65._0_8_ * dVar53) * -0.16666666666666666);
                    if (dVar71 <= dVar52) {
                      dVar52 = dVar71;
                    }
                    auVar66._0_8_ = (ulong)dVar58 & 0x8000000000000000;
                    auVar66._8_8_ = (ulong)dVar76 & 0x8000000000000000;
                    dVar51 = SUB168(auVar66 | _DAT_0078ba10,8);
                    dVar59 = ABS(dVar59 * 1.3333333333333333 +
                                 (auVar63._8_8_ * dVar51 +
                                 auVar63._0_8_ * SUB168(auVar66 | _DAT_0078ba10,0)) *
                                 -0.16666666666666666);
                    if (dVar61 <= dVar59) {
                      dVar59 = dVar61;
                    }
                    pdVar36[lVar46] =
                         dVar59 * dVar53 * (1.0 - *(double *)(lVar26 + lVar46 * 8) * dVar50) * 0.5 +
                         dVar2;
                    pdVar47[lVar46] = dVar51 * dVar52 * (-1.0 - dVar60 * dVar50) * 0.5 + dVar1;
                    lVar46 = lVar46 + 1;
                  } while ((iVar10 - iVar4) + 1 != (int)lVar46);
                }
                lVar21 = lVar21 + 1;
                pdVar47 = pdVar47 + lVar13;
                pdVar36 = pdVar36 + lVar12;
                lVar26 = lVar26 + lVar25;
                lVar48 = lVar48 + lVar25;
                pdVar35 = pdVar35 + lVar14;
                pdVar31 = pdVar31 + lVar14;
                pdVar34 = pdVar34 + lVar14;
                pdVar38 = pdVar38 + lVar14;
                pdVar42 = pdVar42 + lVar14;
                pdVar39 = pdVar39 + lVar14;
              } while (iVar11 + 1 != (int)lVar21);
            }
            bVar49 = iVar5 != iVar9;
            local_2e8 = local_2e8 + 1;
            local_2e4 = local_2e4 + 1;
            iVar5 = iVar5 + 1;
            iVar18 = iVar18 + 1;
            iVar22 = iVar22 + 1;
            iVar16 = iVar16 + 1;
          } while (bVar49);
        }
        uVar28 = uVar28 + 1;
        local_1e0 = local_1e0 + lVar40;
        local_260 = local_260 + lVar24;
        local_268 = local_268 + lVar45;
      } while (uVar28 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar12 = Ipz->jstride;
    lVar13 = Imz->jstride;
    iVar5 = (zebox->smallend).vect[1];
    lVar37 = (long)iVar5;
    iVar6 = (zebox->smallend).vect[0];
    lVar40 = (long)iVar6;
    lVar23 = vcc->nstride * 0x10 + (lVar37 - (vcc->begin).y) * vcc->jstride * 8 + lVar40 * 8 +
             (long)(vcc->begin).x * -8;
    lVar14 = q->jstride;
    lVar24 = (lVar37 - (q->begin).y) * lVar14;
    uVar7 = (q->begin).z;
    iVar22 = iVar3 + 1;
    iVar29 = iVar4 - uVar7;
    lVar45 = q->kstride;
    lVar20 = (long)(q->begin).x;
    local_e0 = q->p;
    local_e8 = local_e0 + (((int)((iVar3 - uVar7) + 2) * lVar45 + lVar24 + lVar40) - lVar20);
    local_f0 = local_e0 + (((int)(iVar22 - uVar7) * lVar45 + lVar24 + lVar40) - lVar20);
    local_f8 = local_e0 + (((int)(iVar3 - uVar7) * lVar45 + lVar24 + lVar40) - lVar20);
    local_100 = local_e0 + (((int)(iVar3 + ~uVar7) * lVar45 + lVar24 + lVar40) - lVar20);
    local_108 = local_e0 + (((iVar29 + -2) * lVar45 + lVar24 + lVar40) - lVar20);
    local_110 = local_e0 + (((int)((iVar4 + -1) - uVar7) * lVar45 + lVar24 + lVar40) - lVar20);
    local_118 = local_e0 + ((iVar29 * lVar45 + lVar24 + lVar40) - lVar20);
    local_120 = local_e0 + (((iVar29 + 1) * lVar45 + lVar24 + lVar40) - lVar20);
    local_128 = local_e0 + (((int)(~uVar7 + iVar4) * lVar45 + lVar24 + lVar40) - lVar20);
    local_e0 = local_e0 + ((lVar24 + lVar40) - lVar20);
    lVar20 = q->nstride;
    pdVar15 = vcc->p;
    local_220 = Ipz->p + (((lVar37 - (Ipz->begin).y) * lVar12 + lVar40) - (long)(Ipz->begin).x);
    lVar24 = Ipz->kstride;
    lVar41 = Ipz->nstride;
    iVar29 = (Ipz->begin).z;
    local_218 = Imz->p + (((lVar37 - (Imz->begin).y) * lVar13 + lVar40) - (long)(Imz->begin).x);
    lVar40 = Imz->kstride;
    lVar27 = Imz->nstride;
    iVar8 = (Imz->begin).z;
    iVar9 = (zebox->smallend).vect[2];
    iVar10 = (zebox->bigend).vect[2];
    iVar11 = (zebox->bigend).vect[0];
    iVar19 = (zebox->bigend).vect[1];
    lVar25 = vcc->kstride * 8;
    lVar30 = -(long)(vcc->begin).z;
    lVar32 = vcc->jstride * 8;
    lVar45 = lVar45 * 8;
    iVar18 = iVar9 - uVar7;
    local_1b8 = 0;
    do {
      local_24c = iVar9 + -1;
      local_248 = iVar18 + -3;
      local_244 = iVar18 + 2;
      local_240 = iVar18 + -2;
      iVar16 = iVar9;
      local_23c = iVar18;
      if (iVar9 <= iVar10) {
        do {
          local_23c = local_23c + 1;
          if (iVar5 <= iVar19) {
            lVar46 = (long)iVar16;
            pdVar36 = (double *)((lVar46 - iVar8) * lVar40 * 8 + (long)local_218);
            lVar33 = (long)local_24c;
            pdVar47 = (double *)((lVar33 - iVar29) * lVar24 * 8 + (long)local_220);
            lVar21 = (long)pdVar15 + (lVar30 + lVar33) * lVar25 + lVar23;
            lVar26 = (long)pdVar15 + (lVar30 + lVar46) * lVar25 + lVar23;
            pdVar35 = (double *)(local_248 * lVar45 + (long)local_e0);
            pdVar38 = (double *)(local_244 * lVar45 + (long)local_e0);
            pdVar42 = (double *)(local_240 * lVar45 + (long)local_e0);
            pdVar31 = (double *)(local_23c * lVar45 + (long)local_e0);
            pdVar34 = (double *)((lVar33 + -(long)(int)uVar7) * lVar45 + (long)local_e0);
            pdVar39 = (double *)((-(long)(int)uVar7 + lVar46) * lVar45 + (long)local_e0);
            iVar43 = iVar16 + -1;
            local_268 = local_128;
            local_2b0 = local_120;
            local_2b8 = local_118;
            local_1e8 = local_110;
            local_2c0 = local_108;
            local_270 = local_100;
            local_278 = local_f8;
            local_280 = local_f0;
            local_288 = local_e8;
            lVar33 = lVar37;
            do {
              if (iVar6 <= iVar11) {
                uVar44 = pbc[local_1b8].bc[2] - 3;
                bVar49 = pbc[local_1b8].bc[5] - 3U < 2;
                lVar46 = 0;
                do {
                  dVar1 = pdVar39[lVar46];
                  dVar2 = pdVar34[lVar46];
                  dVar52 = pdVar42[lVar46];
                  dVar60 = dVar1 - dVar2;
                  dVar59 = dVar2 - dVar52;
                  dVar51 = 0.0;
                  dVar53 = (dVar60 + dVar59) * 0.5;
                  dVar55 = ABS(dVar60);
                  dVar57 = ABS(dVar59);
                  dVar67 = 0.0;
                  if (0.0 <= dVar60 * dVar59) {
                    dVar67 = dVar55;
                    if (dVar57 <= dVar55) {
                      dVar67 = dVar57;
                    }
                    dVar67 = dVar67 + dVar67;
                  }
                  dVar56 = pdVar31[lVar46];
                  dVar71 = dVar56 - dVar1;
                  dVar58 = pdVar38[lVar46] - dVar56;
                  dVar72 = (dVar71 + dVar58) * 0.5;
                  if (0.0 <= dVar71 * dVar58) {
                    dVar51 = ABS(dVar58);
                    if (ABS(dVar71) <= ABS(dVar58)) {
                      dVar51 = ABS(dVar71);
                    }
                    dVar51 = dVar51 + dVar51;
                  }
                  dVar58 = (dVar60 + dVar71) * 0.5;
                  local_1c8 = 0.0;
                  if (0.0 <= dVar60 * dVar71) {
                    local_1c8 = ABS(dVar71);
                    if (ABS(dVar60) <= ABS(dVar71)) {
                      local_1c8 = ABS(dVar60);
                    }
                    local_1c8 = local_1c8 + local_1c8;
                  }
                  dVar76 = (double)((ulong)dVar53 & 0x8000000000000000 | 0x3ff0000000000000);
                  dVar61 = ABS(dVar53);
                  if (dVar67 <= ABS(dVar53)) {
                    dVar61 = dVar67;
                  }
                  dVar61 = dVar61 * dVar76;
                  dVar67 = ABS(dVar72);
                  if (dVar51 <= dVar67) {
                    dVar67 = dVar51;
                  }
                  dVar67 = dVar67 * (double)((ulong)dVar72 & 0x8000000000000000 | 0x3ff0000000000000
                                            );
                  dVar51 = (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000);
                  uVar28 = (ulong)DAT_0078ba10;
                  if (iVar3 != iVar16 || 1 < uVar44) {
                    dVar73 = dVar58 * 1.3333333333333333 + (dVar61 + dVar67) * -0.16666666666666666;
                    dVar72 = dVar51;
                    if ((uVar44 < 2) && (iVar22 == iVar16)) {
                      dVar61 = local_278[lVar46];
                      dVar74 = local_280[lVar46] - dVar61;
                      dVar75 = dVar61 - local_270[lVar46];
                      dVar74 = dVar74 + dVar74;
                      dVar75 = dVar75 + dVar75;
                      dVar73 = 0.0;
                      if (0.0 <= dVar75 * dVar74) {
                        dVar73 = ABS(dVar74);
                        dVar75 = ABS(dVar75);
                        if (dVar75 <= dVar73) {
                          dVar73 = dVar75;
                        }
                      }
                      dVar74 = local_288[lVar46] * -0.1 +
                               local_280[lVar46] * 0.6666666666666666 +
                               local_270[lVar46] * -1.0666666666666667 + dVar61 * 0.5;
                      dVar61 = ABS(dVar74);
                      if (dVar73 <= dVar61) {
                        dVar61 = dVar73;
                      }
                      dVar61 = dVar61 * (double)((ulong)dVar74 & 0x8000000000000000 | uVar28);
                      dVar73 = dVar58 * 1.3333333333333333 +
                               (dVar67 + dVar61) * -0.16666666666666666;
                    }
                  }
                  else {
                    local_1c8 = 0.0;
                    if (0.0 <= (dVar60 + dVar60) * (dVar71 + dVar71)) {
                      dVar67 = ABS(dVar60 + dVar60);
                      local_1c8 = ABS(dVar71 + dVar71);
                      if (dVar67 <= local_1c8) {
                        local_1c8 = dVar67;
                      }
                    }
                    dVar73 = pdVar38[lVar46] * -0.1 +
                             dVar56 * 0.6666666666666666 + dVar2 * -1.0666666666666667 + dVar1 * 0.5
                    ;
                    dVar72 = (double)((ulong)dVar73 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  dVar67 = *(double *)(lVar26 + lVar46 * 8);
                  if (iVar4 != iVar16 || !bVar49) {
                    if (iVar4 + -1 == iVar16 && bVar49) {
                      dVar73 = local_2b8[lVar46];
                      dVar74 = local_2b0[lVar46] - dVar73;
                      dVar75 = dVar73 - local_1e8[lVar46];
                      dVar74 = dVar74 + dVar74;
                      dVar75 = dVar75 + dVar75;
                      uVar68 = 0;
                      uVar69 = 0;
                      if (0.0 <= dVar75 * dVar74) {
                        dVar74 = ABS(dVar74);
                        dVar75 = ABS(dVar75);
                        if (dVar75 <= dVar74) {
                          dVar74 = dVar75;
                        }
                        uVar68 = SUB84(dVar74,0);
                        uVar69 = (undefined4)((ulong)dVar74 >> 0x20);
                      }
                      dVar74 = local_2c0[lVar46] * 0.1 +
                               local_1e8[lVar46] * -0.6666666666666666 +
                               local_2b0[lVar46] * 1.0666666666666667 + dVar73 * -0.5;
                      dVar73 = ABS(dVar74);
                      if ((double)CONCAT44(uVar69,uVar68) <= dVar73) {
                        dVar73 = (double)CONCAT44(uVar69,uVar68);
                      }
                      dVar73 = dVar58 * 1.3333333333333333 +
                               (dVar61 + dVar73 * (double)((ulong)dVar74 & 0x8000000000000000 |
                                                          uVar28)) * -0.16666666666666666;
                    }
                  }
                  else {
                    local_1c8 = 0.0;
                    if (0.0 <= (dVar60 + dVar60) * (dVar71 + dVar71)) {
                      dVar72 = ABS(dVar60 + dVar60);
                      local_1c8 = ABS(dVar71 + dVar71);
                      if (dVar72 <= local_1c8) {
                        local_1c8 = dVar72;
                      }
                    }
                    dVar73 = dVar52 * 0.1 +
                             dVar2 * -0.6666666666666666 +
                             dVar56 * 1.0666666666666667 + dVar1 * -0.5;
                    dVar72 = (double)((ulong)dVar73 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  dVar61 = dVar52 - pdVar35[lVar46];
                  dVar74 = (dVar59 + dVar61) * 0.5;
                  dVar75 = 0.0;
                  dVar70 = 0.0;
                  if (0.0 <= dVar59 * dVar61) {
                    dVar70 = ABS(dVar59);
                    if (ABS(dVar61) <= ABS(dVar59)) {
                      dVar70 = ABS(dVar61);
                    }
                    dVar70 = dVar70 + dVar70;
                  }
                  if (0.0 <= dVar60 * dVar71) {
                    dVar75 = ABS(dVar71);
                    if (ABS(dVar60) <= ABS(dVar71)) {
                      dVar75 = ABS(dVar60);
                    }
                    dVar75 = dVar75 + dVar75;
                  }
                  dVar71 = 0.0;
                  if (0.0 <= dVar60 * dVar59) {
                    if (dVar57 <= dVar55) {
                      dVar55 = dVar57;
                    }
                    dVar71 = dVar55 + dVar55;
                  }
                  dVar55 = ABS(dVar74);
                  if (dVar70 <= dVar55) {
                    dVar55 = dVar70;
                  }
                  dVar55 = dVar55 * (double)((ulong)dVar74 & 0x8000000000000000 | uVar28);
                  dVar57 = ABS(dVar58);
                  if (dVar75 <= ABS(dVar58)) {
                    dVar57 = dVar75;
                  }
                  if (iVar43 != iVar3 || 1 < uVar44) {
                    dVar56 = dVar53 * 1.3333333333333333 +
                             (dVar55 + dVar51 * dVar57) * -0.16666666666666666;
                    if ((uVar44 < 2) && (iVar22 == iVar43)) {
                      dVar55 = local_278[lVar46];
                      dVar58 = local_280[lVar46] - dVar55;
                      dVar61 = dVar55 - local_270[lVar46];
                      dVar58 = dVar58 + dVar58;
                      dVar61 = dVar61 + dVar61;
                      dVar56 = 0.0;
                      if (0.0 <= dVar61 * dVar58) {
                        dVar56 = ABS(dVar58);
                        dVar61 = ABS(dVar61);
                        if (dVar61 <= dVar56) {
                          dVar56 = dVar61;
                        }
                      }
                      dVar58 = local_288[lVar46] * -0.1 +
                               local_280[lVar46] * 0.6666666666666666 +
                               local_270[lVar46] * -1.0666666666666667 + dVar55 * 0.5;
                      dVar55 = ABS(dVar58);
                      if (dVar56 <= dVar55) {
                        dVar55 = dVar56;
                      }
                      dVar55 = dVar55 * (double)((ulong)dVar58 & 0x8000000000000000 | uVar28);
                      dVar56 = dVar53 * 1.3333333333333333 +
                               (dVar51 * dVar57 + dVar55) * -0.16666666666666666;
                    }
                  }
                  else {
                    dVar71 = 0.0;
                    if (0.0 <= (dVar59 + dVar59) * (dVar60 + dVar60)) {
                      dVar71 = ABS(dVar60 + dVar60);
                      dVar51 = ABS(dVar59 + dVar59);
                      if (dVar51 <= dVar71) {
                        dVar71 = dVar51;
                      }
                    }
                    dVar56 = dVar56 * -0.1 +
                             dVar1 * 0.6666666666666666 + dVar52 * -1.0666666666666667 + dVar2 * 0.5
                    ;
                    dVar76 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  if (iVar43 == iVar4 && bVar49) {
                    dVar71 = 0.0;
                    if (0.0 <= (dVar59 + dVar59) * (dVar60 + dVar60)) {
                      dVar71 = ABS(dVar60 + dVar60);
                      dVar53 = ABS(dVar59 + dVar59);
                      if (dVar53 <= dVar71) {
                        dVar71 = dVar53;
                      }
                    }
                    dVar56 = pdVar35[lVar46] * 0.1 +
                             dVar52 * -0.6666666666666666 +
                             dVar1 * 1.0666666666666667 + dVar2 * -0.5;
                    dVar76 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else if (iVar4 == iVar16 && bVar49) {
                    dVar52 = local_2b8[lVar46];
                    dVar59 = local_2b0[lVar46] - dVar52;
                    dVar51 = dVar52 - local_268[lVar46];
                    dVar59 = dVar59 + dVar59;
                    dVar51 = dVar51 + dVar51;
                    dVar60 = 0.0;
                    if (0.0 <= dVar51 * dVar59) {
                      dVar60 = ABS(dVar59);
                      dVar51 = ABS(dVar51);
                      if (dVar51 <= dVar60) {
                        dVar60 = dVar51;
                      }
                    }
                    dVar59 = local_2c0[lVar46] * 0.1 +
                             local_268[lVar46] * -0.6666666666666666 +
                             local_2b0[lVar46] * 1.0666666666666667 + dVar52 * -0.5;
                    dVar52 = ABS(dVar59);
                    if (dVar60 <= dVar52) {
                      dVar52 = dVar60;
                    }
                    dVar56 = dVar53 * 1.3333333333333333 +
                             (dVar55 + dVar52 * (double)((ulong)dVar59 & 0x8000000000000000 | uVar28
                                                        )) * -0.16666666666666666;
                  }
                  dVar52 = ABS(dVar73);
                  if (local_1c8 <= ABS(dVar73)) {
                    dVar52 = local_1c8;
                  }
                  dVar53 = ABS(dVar56);
                  if (dVar71 <= ABS(dVar56)) {
                    dVar53 = dVar71;
                  }
                  pdVar47[lVar46] =
                       dVar53 * dVar76 * (1.0 - *(double *)(lVar21 + lVar46 * 8) * dVar50) * 0.5 +
                       dVar2;
                  pdVar36[lVar46] = dVar72 * dVar52 * (-1.0 - dVar67 * dVar50) * 0.5 + dVar1;
                  lVar46 = lVar46 + 1;
                } while ((iVar11 - iVar6) + 1 != (int)lVar46);
              }
              lVar33 = lVar33 + 1;
              pdVar36 = pdVar36 + lVar13;
              pdVar47 = pdVar47 + lVar12;
              lVar21 = lVar21 + lVar32;
              lVar26 = lVar26 + lVar32;
              local_288 = local_288 + lVar14;
              local_280 = local_280 + lVar14;
              local_278 = local_278 + lVar14;
              local_270 = local_270 + lVar14;
              local_2c0 = local_2c0 + lVar14;
              local_1e8 = local_1e8 + lVar14;
              local_2b8 = local_2b8 + lVar14;
              local_2b0 = local_2b0 + lVar14;
              local_268 = local_268 + lVar14;
              pdVar35 = pdVar35 + lVar14;
              pdVar38 = pdVar38 + lVar14;
              pdVar42 = pdVar42 + lVar14;
              pdVar31 = pdVar31 + lVar14;
              pdVar34 = pdVar34 + lVar14;
              pdVar39 = pdVar39 + lVar14;
            } while (iVar19 + 1 != (int)lVar33);
          }
          bVar49 = iVar16 != iVar10;
          local_24c = local_24c + 1;
          local_248 = local_248 + 1;
          local_244 = local_244 + 1;
          local_240 = local_240 + 1;
          iVar16 = iVar16 + 1;
        } while (bVar49);
      }
      local_1b8 = local_1b8 + 1;
      local_218 = local_218 + lVar27;
      local_220 = local_220 + lVar41;
      local_e8 = local_e8 + lVar20;
      local_f0 = local_f0 + lVar20;
      local_f8 = local_f8 + lVar20;
      local_100 = local_100 + lVar20;
      local_108 = local_108 + lVar20;
      local_110 = local_110 + lVar20;
      local_118 = local_118 + lVar20;
      local_120 = local_120 + lVar20;
      local_128 = local_128 + lVar20;
      local_e0 = local_e0 + lVar20;
    } while (local_1b8 != (uint)ncomp);
  }
  return;
}

Assistant:

void
PLM::PredictVelOnZFace ( Box const& zebox, int ncomp,
                         Array4<Real> const& Imz, Array4<Real> const& Ipz,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_klo >= zebox.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= zebox.bigEnd(2)))
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,domain_klo,domain_khi,Ipz,Imz,dtdz,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                    (bc.lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                    (bc.hi(2) == BCType::hoextrap);

            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);


            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
    else
    {
        amrex::ParallelFor(zebox, ncomp, [q,vcc,Ipz,Imz,dtdz]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real wpls = q(i,j,k  ,n) + 0.5 * (-1.0 - vcc(i,j,k  ,2) * dtdz) *
                amrex_calc_zslope(i,j,k  ,n,order,q);
            Real wmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - vcc(i,j,k-1,2) * dtdz) *
                amrex_calc_zslope(i,j,k-1,n,order,q);

            Ipz(i,j,k-1,n) = wmns;
            Imz(i,j,k  ,n) = wpls;
        });
    }
}